

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzelchdiv.cpp
# Opt level: O0

void __thiscall
TPZCompElHDiv<pzshape::TPZShapeQuad>::TPZCompElHDiv
          (TPZCompElHDiv<pzshape::TPZShapeQuad> *this,TPZCompMesh *mesh,TPZGeoEl *gel,
          HDivFamily hdivfam)

{
  uchar uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  undefined4 uVar5;
  uint uVar6;
  int64_t iVar7;
  int *piVar8;
  long lVar9;
  long *plVar10;
  TPZConnect *pTVar11;
  TPZManVector<int,_3> *this_00;
  HDivFamily in_ECX;
  TPZGeoEl *in_RDX;
  TPZCompMesh *in_RSI;
  TPZCompElHDiv<pzshape::TPZShapeQuad> *in_RDI;
  int nShapeF;
  TPZConnect *c;
  int icon;
  TPZManVector<int,_3> ord;
  int order_1;
  TPZMatSingleSpace *mat;
  int side;
  int firstside;
  TPZManVector<int,_3> order;
  int sideorder;
  int sideaux;
  int i;
  TPZStack<int,_10> facesides;
  int nconflux;
  int in_stack_fffffffffffffdec;
  int in_stack_fffffffffffffdf0;
  int in_stack_fffffffffffffdf4;
  TPZCompEl *in_stack_fffffffffffffdf8;
  undefined4 in_stack_fffffffffffffe00;
  int in_stack_fffffffffffffe04;
  undefined4 in_stack_fffffffffffffe08;
  undefined4 in_stack_fffffffffffffe0c;
  TPZCompMesh *in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe1c;
  TPZIntelGen<pzshape::TPZShapeQuad> *in_stack_fffffffffffffe20;
  TPZManVector<int,_3> *this_01;
  int local_124;
  int local_e0;
  int in_stack_ffffffffffffff34;
  TPZGeoEl *in_stack_ffffffffffffff38;
  int local_9c;
  TPZVec<int> local_98 [2];
  int local_4c;
  undefined8 local_48;
  undefined4 local_40;
  undefined8 local_30;
  undefined8 local_28;
  HDivFamily local_1c;
  TPZGeoEl *local_18;
  TPZCompMesh *local_10;
  
  local_28 = 0;
  local_30 = 0x21;
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  TPZRegisterClassId::TPZRegisterClassId<TPZCompElHDiv<pzshape::TPZShapeQuad>>
            ((TPZRegisterClassId *)in_RDI,0x21);
  TPZSavable::TPZSavable((TPZSavable *)in_RDI,&PTR_PTR_024bc398);
  TPZIntelGen<pzshape::TPZShapeQuad>::TPZIntelGen
            (in_stack_fffffffffffffe20,
             (void **)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
             in_stack_fffffffffffffe10,
             (TPZGeoEl *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
             in_stack_fffffffffffffe04);
  *(undefined ***)
   &(in_RDI->super_TPZIntelGen<pzshape::TPZShapeQuad>).super_TPZInterpolatedElement.
    super_TPZInterpolationSpace.super_TPZCompEl = &PTR__TPZCompElHDiv_024bbf78;
  *(undefined ***)
   &(in_RDI->super_TPZIntelGen<pzshape::TPZShapeQuad>).super_TPZInterpolatedElement.
    super_TPZInterpolationSpace.super_TPZCompEl = &PTR__TPZCompElHDiv_024bbf78;
  local_40 = 1;
  TPZManVector<int,_4>::TPZManVector
            ((TPZManVector<int,_4> *)in_stack_fffffffffffffe20,
             CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
             (int *)in_stack_fffffffffffffe10);
  std::__cxx11::list<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_>::list
            ((list<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_> *)0x1a042a1);
  local_48 = 0xffffffffffffffff;
  TPZManVector<long,_5>::TPZManVector
            ((TPZManVector<long,_5> *)in_stack_fffffffffffffe20,
             CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
             (long *)in_stack_fffffffffffffe10);
  in_RDI->fhdivfam = local_1c;
  iVar2 = TPZCompMesh::GetDefaultOrder(local_10);
  (in_RDI->super_TPZIntelGen<pzshape::TPZShapeQuad>).super_TPZInterpolatedElement.
  super_TPZInterpolationSpace.fPreferredOrder = iVar2;
  local_4c = NConnects(in_RDI);
  TPZManVector<long,_5>::Resize
            ((TPZManVector<long,_5> *)in_stack_fffffffffffffe20,
             CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
  TPZGeoEl::SetReference(local_18,(TPZCompEl *)in_RDI);
  TPZStack<int,_10>::TPZStack
            ((TPZStack<int,_10> *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
  pztopology::TPZQuadrilateral::LowerDimensionSides
            (in_stack_fffffffffffffe04,(TPZStack<int,_10> *)in_stack_fffffffffffffdf8,
             in_stack_fffffffffffffdf4);
  TPZStack<int,_10>::Push
            ((TPZStack<int,_10> *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
             in_stack_fffffffffffffdec);
  for (local_9c = 0; iVar7 = TPZVec<int>::size(local_98), local_9c < iVar7; local_9c = local_9c + 1)
  {
    piVar8 = TPZVec<int>::operator[](local_98,(long)local_9c);
    iVar2 = *piVar8;
    lVar9 = (**(code **)(*(long *)&(in_RDI->super_TPZIntelGen<pzshape::TPZShapeQuad>).
                                   super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                   super_TPZCompEl + 0x370))(in_RDI,iVar2);
    plVar10 = TPZVec<long>::operator[](&(in_RDI->fConnectIndexes).super_TPZVec<long>,(long)local_9c)
    ;
    *plVar10 = lVar9;
    TPZCompMesh::ConnectVec(local_10);
    TPZVec<long>::operator[](&(in_RDI->fConnectIndexes).super_TPZVec<long>,(long)local_9c);
    pTVar11 = TPZChunkVector<TPZConnect,_10>::operator[]
                        ((TPZChunkVector<TPZConnect,_10> *)in_stack_fffffffffffffe10,
                         CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
    TPZConnect::IncrementElConnected(pTVar11);
    (**(code **)(*(long *)&(in_RDI->super_TPZIntelGen<pzshape::TPZShapeQuad>).
                           super_TPZInterpolatedElement.super_TPZInterpolationSpace.super_TPZCompEl
                + 0x378))(in_RDI,iVar2);
  }
  iVar2 = (**(code **)(*(long *)&(in_RDI->super_TPZIntelGen<pzshape::TPZShapeQuad>).
                                 super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                 super_TPZCompEl + 0x338))(in_RDI,8);
  iVar3 = TPZIntQuad::GetMaxOrder(&(in_RDI->super_TPZIntelGen<pzshape::TPZShapeQuad>).fIntRule);
  if (iVar3 < (iVar2 + 1) * 2) {
    TPZIntQuad::GetMaxOrder(&(in_RDI->super_TPZIntelGen<pzshape::TPZShapeQuad>).fIntRule);
  }
  TPZManVector<int,_3>::TPZManVector
            ((TPZManVector<int,_3> *)in_stack_fffffffffffffe20,
             CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
             (int *)in_stack_fffffffffffffe10);
  TPZIntQuad::SetOrder
            ((TPZIntQuad *)in_stack_fffffffffffffe10,
             (TPZVec<int> *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
             in_stack_fffffffffffffe04);
  for (local_e0 = 4; local_e0 < 8; local_e0 = local_e0 + 1) {
    TPZCompEl::Reference(in_stack_fffffffffffffdf8);
    iVar2 = TPZGeoEl::NormalOrientation(in_stack_ffffffffffffff38,in_stack_ffffffffffffff34);
    piVar8 = TPZVec<int>::operator[](&(in_RDI->fSideOrient).super_TPZVec<int>,(long)(local_e0 + -4))
    ;
    *piVar8 = iVar2;
  }
  lVar9 = (**(code **)(*(long *)&(in_RDI->super_TPZIntelGen<pzshape::TPZShapeQuad>).
                                 super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                 super_TPZCompEl + 0xb8))();
  if (lVar9 == 0) {
    this_00 = (TPZManVector<int,_3> *)0x0;
  }
  else {
    this_00 = (TPZManVector<int,_3> *)
              __dynamic_cast(lVar9,&TPZMaterial::typeinfo,&TPZMatSingleSpace::typeinfo,
                             0xfffffffffffffffe);
  }
  if (this_00 != (TPZManVector<int,_3> *)0x0) {
    this_01 = this_00;
    uVar4 = (**(code **)(*(long *)&(in_RDI->super_TPZIntelGen<pzshape::TPZShapeQuad>).
                                   super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                   super_TPZCompEl + 0x268))();
    iVar2 = (*(this_00->super_TPZVec<int>)._vptr_TPZVec[0xb])(this_00,(ulong)uVar4);
    uVar5 = (**(code **)(*(long *)local_18 + 0x210))();
    TPZManVector<int,_3>::TPZManVector
              (this_01,CONCAT44(uVar4,in_stack_fffffffffffffe18),(int *)this_00);
    TPZIntQuad::SetOrder
              ((TPZIntQuad *)this_00,(TPZVec<int> *)CONCAT44(iVar2,uVar5),in_stack_fffffffffffffe04)
    ;
    TPZManVector<int,_3>::~TPZManVector
              ((TPZManVector<int,_3> *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0)
              );
  }
  if (in_RDI->fhdivfam == EHDivConstant) {
    local_124 = 0;
    while (iVar2 = local_124,
          iVar3 = (**(code **)(*(long *)&(in_RDI->super_TPZIntelGen<pzshape::TPZShapeQuad>).
                                         super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                         super_TPZCompEl + 0x90))(), iVar2 < iVar3) {
      pTVar11 = (TPZConnect *)
                (**(code **)(*(long *)&(in_RDI->super_TPZIntelGen<pzshape::TPZShapeQuad>).
                                       super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                       super_TPZCompEl + 0xa8))(in_RDI,local_124);
      in_stack_fffffffffffffdf0 = local_124;
      uVar1 = TPZConnect::Order(pTVar11);
      in_stack_fffffffffffffdf4 = CONCAT13(uVar1,(int3)in_stack_fffffffffffffdf4);
      uVar4 = (**(code **)(*(long *)&(in_RDI->super_TPZIntelGen<pzshape::TPZShapeQuad>).
                                     super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                     super_TPZCompEl + 0x260))
                        (in_RDI,in_stack_fffffffffffffdf0,uVar1);
      uVar6 = TPZConnect::NShape(pTVar11);
      if (uVar6 != uVar4) {
        pzinternal::DebugStopImpl((char *)this,(size_t)mesh);
      }
      local_124 = local_124 + 1;
    }
  }
  TPZManVector<int,_3>::~TPZManVector
            ((TPZManVector<int,_3> *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
  TPZStack<int,_10>::~TPZStack((TPZStack<int,_10> *)0x1a0499b);
  return;
}

Assistant:

TPZCompElHDiv<TSHAPE>::TPZCompElHDiv(TPZCompMesh &mesh, TPZGeoEl *gel, const HDivFamily hdivfam) :
TPZRegisterClassId(&TPZCompElHDiv::ClassId),
TPZIntelGen<TSHAPE>(mesh,gel,1), fSideOrient(TSHAPE::NFacets,1), fhdivfam(hdivfam) {
	this->TPZInterpolationSpace::fPreferredOrder = mesh.GetDefaultOrder();
	int nconflux= TPZCompElHDiv::NConnects();
    this->fConnectIndexes.Resize(nconflux);
	gel->SetReference(this);

//    int nfaces = TSHAPE::NumSides(TSHAPE::Dimension-1);
    TPZStack<int> facesides;
    TSHAPE::LowerDimensionSides(TSHAPE::NSides-1,facesides,TSHAPE::Dimension-1);
    facesides.Push(TSHAPE::NSides-1);
	for(int i=0;i< facesides.size(); i++)
	{
        int sideaux= facesides[i];
		this->fConnectIndexes[i] = this->CreateMidSideConnect(sideaux);
#ifdef PZ_LOG
        if (logger.isDebugEnabled())
        {
            std::stringstream sout;
            sout << "After creating last flux connect " << i << std::endl;
            //	this->Print(sout);
            LOGPZ_DEBUG(logger,sout.str())
        }
#endif

		mesh.ConnectVec()[this->fConnectIndexes[i]].IncrementElConnected();
		this->IdentifySideOrder(sideaux);
    }


    int sideorder = EffectiveSideOrder(TSHAPE::NSides-1);
//    if(TSHAPE::Type()==EQuadrilateral)
//    {
//        sideorder++;
//    }

    sideorder++;

	sideorder = 2*sideorder;
	if (sideorder > this->fIntRule.GetMaxOrder()) sideorder = this->fIntRule.GetMaxOrder();
	TPZManVector<int,3> order(3,sideorder);
	this->fIntRule.SetOrder(order);
    int firstside = TSHAPE::NSides-TSHAPE::NFacets-1;
    for(int side = firstside ; side < TSHAPE::NSides-1; side++ )
    {
        fSideOrient[side-firstside] = this->Reference()->NormalOrientation(side);
    }
    auto *mat =
        dynamic_cast<TPZMatSingleSpace *>(this->Material());
    if (mat)
    {
        int order = mat->IntegrationRuleOrder(MaxOrder());
        TPZManVector<int,3> ord(gel->Dimension(),order);
        this->fIntRule.SetOrder(ord);
    }

    if (fhdivfam == HDivFamily::EHDivConstant) {
        // For HDiv constant, polynomial order was compatibilized in connectorders, 
        // see TPZShapeHDivConstant<TSHAPE>::Initialize. So now we need to update
        // the number of shape functions and also the integration rule
        if (TSHAPE::Type() == ETriangle || TSHAPE::Type() == EQuadrilateral || TSHAPE::Type() == ETetraedro){
            for (int icon = 0; icon < this->NConnects(); icon++)
            {
                TPZConnect &c = this->Connect(icon);
                int nShapeF = NConnectShapeF(icon,c.Order());
                if (c.NShape() != nShapeF){
                    DebugStop();
                }
            }
        }
    }
}